

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Bitvector.h
# Opt level: O0

size_t __thiscall
dg::ADT::
SparseBitvectorImpl<unsigned_long,_unsigned_long,_unsigned_long,_1UL,_dg::STLHashMap<unsigned_long,_unsigned_long>_>
::size(SparseBitvectorImpl<unsigned_long,_unsigned_long,_unsigned_long,_1UL,_dg::STLHashMap<unsigned_long,_unsigned_long>_>
       *this)

{
  bool bVar1;
  reference this_00;
  size_t sVar2;
  value_type *it;
  const_iterator __end0;
  const_iterator __begin0;
  STLHashMap<unsigned_long,_unsigned_long> *__range3;
  size_t num;
  unordered_map<unsigned_long,_unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
  *in_stack_ffffffffffffffc8;
  _Node_iterator_base<std::pair<const_unsigned_long,_unsigned_long>,_false> local_28;
  _Node_iterator_base<std::pair<const_unsigned_long,_unsigned_long>,_false> local_20 [2];
  size_t local_10;
  
  local_10 = 0;
  local_20[0]._M_cur =
       (__node_type *)
       std::
       unordered_map<unsigned_long,_unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
       ::begin(in_stack_ffffffffffffffc8);
  local_28._M_cur =
       (__node_type *)
       std::
       unordered_map<unsigned_long,_unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
       ::end(in_stack_ffffffffffffffc8);
  while( true ) {
    bVar1 = std::__detail::operator!=(local_20,&local_28);
    if (!bVar1) break;
    this_00 = std::__detail::
              _Node_const_iterator<std::pair<const_unsigned_long,_unsigned_long>,_false,_false>::
              operator*((_Node_const_iterator<std::pair<const_unsigned_long,_unsigned_long>,_false,_false>
                         *)0x16d769);
    sVar2 = _countBits(this_00->second);
    local_10 = sVar2 + local_10;
    std::__detail::_Node_const_iterator<std::pair<const_unsigned_long,_unsigned_long>,_false,_false>
    ::operator++((_Node_const_iterator<std::pair<const_unsigned_long,_unsigned_long>,_false,_false>
                  *)this_00);
  }
  return local_10;
}

Assistant:

size_t size() const {
        size_t num = 0;
        for (auto &it : _bits)
            num += _countBits(it.second);

        return num;
    }